

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

mz_bool mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint file_index)

{
  mz_uint mVar1;
  mz_zip_internal_state *pArray;
  mz_zip_internal_state *pmVar2;
  uint n;
  mz_bool mVar3;
  size_t sVar4;
  int *piVar5;
  size_t sVar6;
  void *pvVar7;
  ulong uVar8;
  size_t orig_size;
  mz_uint64 mVar9;
  undefined8 *puVar10;
  ulong uVar11;
  mz_uint32 local_header_u32 [8];
  mz_uint8 central_header [46];
  uint local_bc;
  ulong local_b8;
  mz_uint64 local_b0;
  mz_uint64 local_a8;
  int *local_a0;
  undefined8 *local_98;
  ulong local_90;
  int local_88;
  byte local_82;
  ushort local_6e;
  ushort local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined6 uStack_50;
  undefined2 local_4a;
  undefined6 uStack_48;
  undefined4 uStack_42;
  undefined4 uStack_3e;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pArray = pZip->m_pState;
  if (pArray == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) {
    return 0;
  }
  if ((((pSource_zip == (mz_zip_archive *)0x0) ||
       (pmVar2 = pSource_zip->m_pState, pmVar2 == (mz_zip_internal_state *)0x0)) ||
      (pSource_zip->m_total_files <= file_index)) ||
     (pSource_zip->m_zip_mode != MZ_ZIP_MODE_READING)) {
    puVar10 = (undefined8 *)0x0;
  }
  else {
    puVar10 = (undefined8 *)
              ((ulong)*(uint *)((long)(pmVar2->m_central_dir_offsets).m_p + (ulong)file_index * 4) +
              (long)(pmVar2->m_central_dir).m_p);
  }
  if (puVar10 == (undefined8 *)0x0) {
    return 0;
  }
  mVar1 = pZip->m_file_offset_alignment;
  n = 0;
  if (mVar1 != 0) {
    n = mVar1 - ((uint)pZip->m_archive_size & mVar1 - 1) & mVar1 - 1;
  }
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  local_b0 = pZip->m_archive_size;
  local_90 = (ulong)n;
  local_a8 = local_b0 + local_90;
  if (local_a8 - 0xffffffb4 < 0xffffffff00000000) {
    return 0;
  }
  local_b8 = (ulong)*(uint *)((long)puVar10 + 0x2a);
  sVar4 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,local_b8,&local_88,0x1e);
  if (sVar4 != 0x1e) {
    return 0;
  }
  if (local_88 != 0x4034b50) {
    return 0;
  }
  mVar3 = tinyexr::miniz::mz_zip_writer_write_zeros(pZip,local_b0,n);
  if (mVar3 == 0) {
    return 0;
  }
  sVar4 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_a8,&local_88,0x1e);
  if (sVar4 != 0x1e) {
    return 0;
  }
  local_bc = (uint)local_6c + (uint)local_6e;
  uVar8 = (ulong)(local_bc + *(int *)((long)puVar10 + 0x14));
  uVar11 = 0x10000;
  if (uVar8 < 0x10000) {
    uVar11 = uVar8;
  }
  sVar4 = 0x10;
  if (0x10 < uVar11) {
    sVar4 = uVar11;
  }
  piVar5 = (int *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,sVar4);
  if (piVar5 == (int *)0x0) {
    return 0;
  }
  uVar11 = local_b0 + local_90 + 0x1e;
  mVar9 = local_b8 + 0x1e;
  local_98 = puVar10;
  if (uVar8 == 0) {
    sVar4 = (size_t)local_bc;
  }
  else {
    do {
      local_a0 = piVar5;
      sVar4 = 0x10000;
      if (uVar8 < 0x10000) {
        sVar4 = uVar8;
      }
      local_b8 = mVar9;
      local_b0 = uVar8;
      sVar6 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar9,local_a0,sVar4);
      if ((sVar6 != sVar4) ||
         (sVar6 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar11,local_a0,sVar4), sVar6 != sVar4)) {
        local_bc = (uint)sVar4;
        pvVar7 = pZip->m_pAlloc_opaque;
        piVar5 = local_a0;
        goto LAB_00125377;
      }
      mVar9 = local_b8 + sVar4;
      uVar11 = uVar11 + sVar4;
      uVar8 = local_b0 - sVar4;
      piVar5 = local_a0;
    } while (uVar8 != 0);
  }
  local_bc = (uint)sVar4;
  if ((local_82 & 8) == 0) {
LAB_0012518f:
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar5);
    puVar10 = local_98;
    if (uVar11 >> 0x20 == 0) {
      sVar4 = (pArray->m_central_dir).m_size;
      local_68 = *local_98;
      uStack_60 = local_98[1];
      uStack_58 = local_98[2];
      uStack_48 = (undefined6)((ulong)*(undefined8 *)((long)local_98 + 0x1e) >> 0x10);
      uStack_50 = (undefined6)local_98[3];
      local_4a = (undefined2)((ulong)local_98[3] >> 0x30);
      _uStack_42 = CONCAT44((int)local_a8,(int)*(undefined8 *)((long)local_98 + 0x26));
      uVar8 = sVar4 + 0x2e;
      local_b0 = uVar11;
      if ((uVar8 <= (pArray->m_central_dir).m_capacity) ||
         (mVar3 = tinyexr::miniz::mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar8,1),
         mVar3 != 0)) {
        (pArray->m_central_dir).m_size = uVar8;
        uVar11 = (ulong)(pArray->m_central_dir).m_element_size;
        local_b8 = sVar4;
        memcpy((void *)(sVar4 * uVar11 + (long)(pArray->m_central_dir).m_p),&local_68,uVar11 * 0x2e)
        ;
        local_bc = (uint)*(ushort *)(puVar10 + 4) +
                   (uint)*(ushort *)((long)puVar10 + 0x1e) + (uint)*(ushort *)((long)puVar10 + 0x1c)
        ;
        uVar8 = (ulong)local_bc;
        sVar4 = (pArray->m_central_dir).m_size;
        uVar11 = sVar4 + uVar8;
        if ((uVar11 <= (pArray->m_central_dir).m_capacity) ||
           (local_a8 = uVar11,
           mVar3 = tinyexr::miniz::mz_zip_array_ensure_capacity
                             (pZip,&pArray->m_central_dir,uVar11,1), uVar11 = local_a8, mVar3 != 0))
        {
          (pArray->m_central_dir).m_size = uVar11;
          uVar11 = (ulong)(pArray->m_central_dir).m_element_size;
          memcpy((void *)(sVar4 * uVar11 + (long)(pArray->m_central_dir).m_p),
                 (void *)((long)puVar10 + 0x2e),uVar8 * uVar11);
          if (*(int *)((long)&(pArray->m_central_dir).m_size + 4) != 0) {
            return 0;
          }
          local_bc = (uint)local_b8;
          sVar4 = (pArray->m_central_dir_offsets).m_size;
          uVar11 = sVar4 + 1;
          if ((uVar11 <= (pArray->m_central_dir_offsets).m_capacity) ||
             (mVar3 = tinyexr::miniz::mz_zip_array_ensure_capacity
                                (pZip,&pArray->m_central_dir_offsets,uVar11,1), mVar3 != 0)) {
            (pArray->m_central_dir_offsets).m_size = uVar11;
            uVar11 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
            memcpy((void *)(sVar4 * uVar11 + (long)(pArray->m_central_dir_offsets).m_p),&local_bc,
                   uVar11);
            pZip->m_total_files = pZip->m_total_files + 1;
            pZip->m_archive_size = local_b0;
            return 1;
          }
        }
        if ((pArray->m_central_dir).m_capacity < local_b8) {
          pvVar7 = (*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,(pArray->m_central_dir).m_p,
                                       (ulong)(pArray->m_central_dir).m_element_size,local_b8);
          if (pvVar7 == (void *)0x0) {
            return 0;
          }
          (pArray->m_central_dir).m_p = pvVar7;
          (pArray->m_central_dir).m_capacity = local_b8;
        }
        (pArray->m_central_dir).m_size = local_b8;
      }
    }
  }
  else {
    sVar4 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar9,piVar5,0x10);
    if (sVar4 == 0x10) {
      local_bc = (uint)(*piVar5 == 0x8074b50) * 4 + 0xc;
      uVar8 = (ulong)local_bc;
      sVar4 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar11,piVar5,uVar8);
      if (sVar4 == uVar8) {
        uVar11 = uVar11 + uVar8;
        goto LAB_0012518f;
      }
      pvVar7 = pZip->m_pAlloc_opaque;
    }
    else {
      pvVar7 = pZip->m_pAlloc_opaque;
    }
LAB_00125377:
    (*pZip->m_pFree)(pvVar7,piVar5);
  }
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *pZip,
                                          mz_zip_archive *pSource_zip,
                                          mz_uint file_index) {
  mz_uint n, bit_flags, num_alignment_padding_bytes;
  mz_uint64 comp_bytes_remaining, local_dir_header_ofs;
  mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
  mz_uint8 central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
  size_t orig_central_dir_size;
  mz_zip_internal_state *pState;
  void *pBuf;
  const mz_uint8 *pSrc_central_header;

  if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING))
    return MZ_FALSE;
  if (NULL ==
      (pSrc_central_header = mz_zip_reader_get_cdh(pSource_zip, file_index)))
    return MZ_FALSE;
  pState = pZip->m_pState;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) >
       0xFFFFFFFF))
    return MZ_FALSE;

  cur_src_file_ofs =
      MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
  cur_dst_file_ofs = pZip->m_archive_size;

  if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs,
                           pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return MZ_FALSE;
  cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

  if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs,
                                 num_alignment_padding_bytes))
    return MZ_FALSE;
  cur_dst_file_ofs += num_alignment_padding_bytes;
  local_dir_header_ofs = cur_dst_file_ofs;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }

  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pLocal_header,
                     MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

  n = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
      MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  comp_bytes_remaining =
      n + MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);

  if (NULL == (pBuf = pZip->m_pAlloc(
                   pZip->m_pAlloc_opaque, 1,
                   (size_t)MZ_MAX(sizeof(mz_uint32) * 4,
                                  MZ_MIN((mz_uint)MZ_ZIP_MAX_IO_BUF_SIZE,
                                         comp_bytes_remaining)))))
    return MZ_FALSE;

  while (comp_bytes_remaining) {
    n = (mz_uint)MZ_MIN((mz_uint)MZ_ZIP_MAX_IO_BUF_SIZE, comp_bytes_remaining);
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf,
                             n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }
    cur_src_file_ofs += n;

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }
    cur_dst_file_ofs += n;

    comp_bytes_remaining -= n;
  }

  bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
  if (bit_flags & 8) {
    // Copy data descriptor
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf,
                             sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }

    n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == 0x08074b50) ? 4 : 3);
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }

    cur_src_file_ofs += n;
    cur_dst_file_ofs += n;
  }
  pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

  // no zip64 support yet
  if (cur_dst_file_ofs > 0xFFFFFFFF) return MZ_FALSE;

  orig_central_dir_size = pState->m_central_dir.m_size;

  memcpy(central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);
  MZ_WRITE_LE32(central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS,
                local_dir_header_ofs);
  if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, central_header,
                              MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
    return MZ_FALSE;

  n = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
      MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS) +
      MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
  if (!mz_zip_array_push_back(
          pZip, &pState->m_central_dir,
          pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n)) {
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return MZ_FALSE;
  }

  if (pState->m_central_dir.m_size > 0xFFFFFFFF) return MZ_FALSE;
  n = (mz_uint32)orig_central_dir_size;
  if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1)) {
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return MZ_FALSE;
  }

  pZip->m_total_files++;
  pZip->m_archive_size = cur_dst_file_ofs;

  return MZ_TRUE;
}